

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  size_t sVar1;
  PathPtr fromPath_00;
  undefined1 uVar2;
  bool bVar3;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> entry;
  long lVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  String *pSVar7;
  Mutex *this_00;
  Impl *pIVar8;
  StringPtr name;
  StringPtr name_00;
  bool needRollback;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f_1;
  Fault f;
  undefined1 local_c1;
  TransferMode local_c0;
  Type local_bc;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> local_b8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_a8;
  Fault local_a0;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
  local_98;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
  local_78;
  String *local_60;
  _Base_ptr local_58;
  Maybe<unsigned_long> local_50;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_40;
  
  p_Var5 = (_Base_ptr)toPath.parts.size_;
  pSVar7 = toPath.parts.ptr;
  local_c0 = mode;
  local_60 = pSVar7;
  local_58 = p_Var5;
  if (p_Var5 == (_Base_ptr)0x1) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
              (&local_98,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
    if ((char)local_98.func.needRollback != '\0') {
      local_bc = (Type)local_98.func.lock;
      local_a8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)local_98.func.toPath;
      this_00 = &(this->impl).mutex;
      _::Mutex::lock(this_00,EXCLUSIVE);
      pIVar8 = &(this->impl).value;
      sVar1 = (pSVar7->content).size_;
      if (sVar1 == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (pSVar7->content).ptr;
      }
      name_00.content.size_ = sVar1 + (sVar1 == 0);
      name_00.content.ptr = pcVar6;
      local_b8.mutex = this_00;
      local_b8.ptr = pIVar8;
      entry = Impl::openEntry(pIVar8,name_00,toMode);
      if (entry.ptr == (EntryImpl *)0x0) {
        bVar3 = false;
      }
      else {
        local_c1 = ((entry.ptr)->node).tag == 0;
        local_98.func.needRollback = (bool *)&local_c1;
        local_98.func.lock = &local_b8;
        local_98.func.toPath = (PathPtr *)&local_60;
        local_98.canceled = false;
        local_40.ptr.isSet = true;
        local_40.ptr.field_1 = local_78;
        local_50.ptr.isSet = true;
        local_50.ptr.field_1 = local_a8;
        fromPath_00.parts.ptr._4_4_ = fromPath.parts.ptr._4_4_;
        fromPath_00.parts.ptr._0_4_ = fromPath.parts.ptr._0_4_;
        fromPath_00.parts.size_._0_4_ = (undefined4)fromPath.parts.size_;
        fromPath_00.parts.size_._4_4_ = fromPath.parts.size_._4_4_;
        bVar3 = Impl::tryTransferChild
                          (pIVar8,entry.ptr,local_bc,&local_40,&local_50,fromDirectory,fromPath_00,
                           local_c0);
        pIVar8 = local_b8.ptr;
        if (bVar3) {
          lVar4 = (*(code *)**(undefined8 **)(local_b8.ptr)->clock)();
          (pIVar8->lastModified).value.value = lVar4;
          local_c1 = 0;
        }
        else {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                    (&local_a0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x506,FAILED,(char *)0x0,
                     "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                     (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",&fromPath)
          ;
          _::Debug::Fault::~Fault(&local_a0);
        }
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++:1278:11)>
        ::~Deferred(&local_98);
        this_00 = local_b8.mutex;
        if (local_b8.mutex == (Mutex *)0x0) {
          return bVar3;
        }
      }
      _::Mutex::unlock(this_00,EXCLUSIVE);
      return bVar3;
    }
  }
  else if (p_Var5 == (_Base_ptr)0x0) {
    if ((toMode & CREATE) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4f4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault((Fault *)&local_98);
      return false;
    }
  }
  else {
    sVar1 = (pSVar7->content).size_;
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name.content.size_ = (size_t)pcVar6;
    name.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&local_98,name,(int)sVar1 + (uint)(sVar1 == 0));
    if (local_98.func.lock != (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)0x0) {
      uVar2 = (**(code **)(*(_func_int **)local_98.func.lock + 0xa0))
                        (local_98.func.lock,pSVar7 + 1,
                         (undefined1 *)((long)&p_Var5[-1]._M_right + 7),toMode,fromDirectory,
                         local_c0,fromPath.parts.ptr._0_4_,(undefined4)fromPath.parts.size_);
      (**(code **)*(_func_int **)local_98.func.needRollback)
                (local_98.func.needRollback,
                 (long)local_98.func.lock + *(long *)(*(_func_int **)local_98.func.lock + -0x10));
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      // tryTransferChild() needs to at least know the node type, so do an lstat.
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        auto lock = impl.lockExclusive();
        KJ_IF_MAYBE(entry, lock->openEntry(toPath[0], toMode)) {
          // Make sure if we just cerated a new entry, and we don't successfully transfer to it, we
          // remove the entry before returning.
          bool needRollback = entry->node == nullptr;
          KJ_DEFER(if (needRollback) { lock->entries.erase(toPath[0]); });

          if (lock->tryTransferChild(*entry, meta->type, meta->lastModified, meta->size,
                                     fromDirectory, fromPath, mode)) {
            lock->modified();
            needRollback = false;
            return true;
          } else {
            KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath) {
              return false;
            }
          }
        } else {
          return false;
        }
      } else {
        return false;
      }
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_MAYBE(child, tryGetParent(toPath[0], toMode)) {
        return child->get()->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }